

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPBackCompatBlosc.cpp
# Opt level: O1

void __thiscall
adios2::format::BPBackCompatBlosc::GetMetadata
          (BPBackCompatBlosc *this,vector<char,_std::allocator<char>_> *buffer,Params *info)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  bool bVar3;
  char cVar4;
  mapped_type *pmVar5;
  ulong uVar6;
  char cVar7;
  string __str;
  char *local_60;
  uint local_58;
  char local_50 [16];
  key_type local_40;
  
  uVar2 = *(ulong *)(buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                    super__Vector_impl_data._M_start;
  cVar7 = '\x01';
  if (9 < uVar2) {
    uVar6 = uVar2;
    cVar4 = '\x04';
    do {
      cVar7 = cVar4;
      if (uVar6 < 100) {
        cVar7 = cVar7 + -2;
        goto LAB_00615a31;
      }
      if (uVar6 < 1000) {
        cVar7 = cVar7 + -1;
        goto LAB_00615a31;
      }
      if (uVar6 < 10000) goto LAB_00615a31;
      bVar3 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      cVar4 = cVar7 + '\x04';
    } while (bVar3);
    cVar7 = cVar7 + '\x01';
  }
LAB_00615a31:
  local_60 = local_50;
  std::__cxx11::string::_M_construct((ulong)&local_60,cVar7);
  std::__detail::__to_chars_10_impl<unsigned_long>(local_60,local_58,uVar2);
  paVar1 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"InputSize","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](info,&local_40);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if (local_60 != local_50) {
    operator_delete(local_60);
  }
  uVar2 = *(ulong *)((buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                     super__Vector_impl_data._M_start + 8);
  cVar7 = '\x01';
  if (9 < uVar2) {
    uVar6 = uVar2;
    cVar4 = '\x04';
    do {
      cVar7 = cVar4;
      if (uVar6 < 100) {
        cVar7 = cVar7 + -2;
        goto LAB_00615b14;
      }
      if (uVar6 < 1000) {
        cVar7 = cVar7 + -1;
        goto LAB_00615b14;
      }
      if (uVar6 < 10000) goto LAB_00615b14;
      bVar3 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      cVar4 = cVar7 + '\x04';
    } while (bVar3);
    cVar7 = cVar7 + '\x01';
  }
LAB_00615b14:
  local_60 = local_50;
  std::__cxx11::string::_M_construct((ulong)&local_60,cVar7);
  std::__detail::__to_chars_10_impl<unsigned_long>(local_60,local_58,uVar2);
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"OutputSize","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](info,&local_40);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if (local_60 != local_50) {
    operator_delete(local_60);
  }
  return;
}

Assistant:

void BPBackCompatBlosc::GetMetadata(const std::vector<char> &buffer, Params &info) const noexcept
{
    size_t position = 0;
    info["InputSize"] = std::to_string(helper::ReadValue<uint64_t>(buffer, position));
    info["OutputSize"] = std::to_string(helper::ReadValue<uint64_t>(buffer, position));
}